

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,DenseMatrix *wordVectors)

{
  int32_t iVar1;
  element_type *this_00;
  long *in_RSI;
  undefined8 in_RDI;
  undefined1 auVar2 [16];
  string *unaff_retaddr;
  Vector *in_stack_00000008;
  FastText *in_stack_00000010;
  real norm;
  string word;
  int32_t i;
  Vector vec;
  undefined4 in_stack_ffffffffffffffa0;
  real in_stack_ffffffffffffffa4;
  Dictionary *in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  int local_38;
  undefined1 local_28 [24];
  long *local_10;
  
  local_10 = in_RSI;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1adcdd);
  Vector::Vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  DenseMatrix::zero((DenseMatrix *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_38 = 0;
  while( true ) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1add18);
    iVar1 = Dictionary::nwords(this_00);
    if (iVar1 <= local_38) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1add44);
    Dictionary::getWord_abi_cxx11_(in_stack_ffffffffffffffa8,(int32_t)in_stack_ffffffffffffffa4);
    getWordVector(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                  (float)in_RDI);
    in_stack_ffffffffffffffa4 = Vector::norm(in_stack_ffffffffffffffb0);
    if (0.0 < in_stack_ffffffffffffffa4) {
      auVar2._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
      auVar2._0_4_ = 1.0 / in_stack_ffffffffffffffa4;
      (**(code **)(*local_10 + 0x18))(auVar2._0_8_,local_10,local_28,(long)local_38);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    local_38 = local_38 + 1;
  }
  Vector::~Vector((Vector *)0x1ade25);
  return;
}

Assistant:

void FastText::precomputeWordVectors(DenseMatrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addVectorToRow(vec, i, 1.0 / norm);
    }
  }
}